

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O3

void RDL_findIndegree(uint a,uint b,uint *indegree,RDL_sPathInfo *spi)

{
  uint b_00;
  RDL_graph **ppRVar1;
  uint uVar2;
  RDL_graph *pRVar3;
  ulong uVar4;
  
  indegree[b] = 0;
  if (a != b) {
    ppRVar1 = spi->dPaths;
    pRVar3 = ppRVar1[a];
    if (pRVar3->degree[b] != 0) {
      uVar4 = 0;
      do {
        b_00 = pRVar3->adjList[b][uVar4][0];
        uVar2 = indegree[b_00];
        if (uVar2 == 0xffffffff) {
          RDL_findIndegree(a,b_00,indegree,spi);
          uVar2 = indegree[b_00];
          ppRVar1 = spi->dPaths;
        }
        indegree[b_00] = uVar2 + 1;
        uVar4 = uVar4 + 1;
        pRVar3 = ppRVar1[a];
      } while (uVar4 < pRVar3->degree[b]);
    }
  }
  return;
}

Assistant:

static void RDL_findIndegree(unsigned a, unsigned b,
    unsigned *indegree, const RDL_sPathInfo *spi)
{
/* similar to the function "List_Paths" from Vismara*/
  unsigned i, vertex;

  indegree[b] = 0;

  if(a==b)
  {
    return;
  }
  /*for each vertex adjacent to b in U_a*/
  for(i=0; i<spi->dPaths[a]->degree[b]; ++i)
  {
    vertex = spi->dPaths[a]->adjList[b][i][0];
    if (indegree[vertex] == UINT_MAX) {
      RDL_findIndegree(a, vertex, indegree, spi);
    }
    indegree[vertex] += 1;
  }
}